

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeVisitor.cpp
# Opt level: O1

string * __thiscall
OpenMD::CompositeVisitor::toString_abi_cxx11_(string *__return_storage_ptr__,CompositeVisitor *this)

{
  _List_node_base *p_Var1;
  list<std::pair<OpenMD::BaseVisitor_*,_int>,_std::allocator<std::pair<OpenMD::BaseVisitor_*,_int>_>_>
  *plVar2;
  char buffer [65535];
  long *aplStack_10058 [2];
  long alStack_10048 [2];
  char acStack_10038 [65544];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  memcpy(acStack_10038,"******************************************************************\n",0x44);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  snprintf(acStack_10038,0xffff,"Visitor name: %s\n",
           (this->super_BaseVisitor).visitorName._M_dataplus._M_p);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  memcpy(acStack_10038,"Visitor Description: visitor manager  maintaining a priority  list\n",0x44);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  plVar2 = &this->visitorList;
  p_Var1 = (_List_node_base *)plVar2;
  while (p_Var1 = (((_List_base<std::pair<OpenMD::BaseVisitor_*,_int>,_std::allocator<std::pair<OpenMD::BaseVisitor_*,_int>_>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)plVar2) {
    snprintf(acStack_10038,0xffff,"Priority = %d\tvisitor = %s\n",(ulong)*(uint *)&p_Var1[1]._M_prev
             ,*(undefined8 *)((long)p_Var1[1]._M_next + 8));
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  p_Var1 = (plVar2->
           super__List_base<std::pair<OpenMD::BaseVisitor_*,_int>,_std::allocator<std::pair<OpenMD::BaseVisitor_*,_int>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var1 != (_List_node_base *)plVar2) {
    do {
      (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x50))(aplStack_10058);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)aplStack_10058[0]);
      if (aplStack_10058[0] != alStack_10048) {
        operator_delete(aplStack_10058[0],alStack_10048[0] + 1);
      }
      p_Var1 = p_Var1->_M_next;
    } while (p_Var1 != (_List_node_base *)plVar2);
  }
  memcpy(acStack_10038,"******************************************************************\n",0x44);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

const std::string CompositeVisitor::toString() {
    VisitorIterator i;
    std::string result;
    char buffer[65535];

    snprintf(
        buffer, 65535,
        "******************************************************************\n");
    result += buffer;

    snprintf(buffer, 65535, "Visitor name: %s\n", visitorName.c_str());
    result += buffer;

    snprintf(
        buffer, 65535,
        "Visitor Description: visitor manager  maintaining a priority  list\n");
    result += buffer;

    snprintf(buffer, 65535, "visitors in current priority list:\n");
    result += buffer;

    for (i = visitorList.begin(); i != visitorList.end(); ++i) {
      snprintf(buffer, 65535, "Priority = %d\tvisitor = %s\n", (*i).second,
               ((*i).first->getVisitorName()).c_str());
      result += buffer;
    }

    snprintf(buffer, 65535, "Detail information about every visitor:\n");

    for (i = visitorList.begin(); i != visitorList.end(); ++i)
      result += ((*i).first)->toString();

    snprintf(
        buffer, 65535,
        "******************************************************************\n");
    result += buffer;

    return result;
  }